

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O2

int check_retval(void *returnvalue,char *funcname,int opt)

{
  int iVar1;
  char *__format;
  
  if (returnvalue == (void *)0x0 && opt == 0) {
    __format = "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n";
LAB_0010304d:
    fprintf(_stderr,__format,funcname);
LAB_00103057:
    iVar1 = 1;
  }
  else {
    if (opt == 1) {
      if (*returnvalue < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",funcname);
        goto LAB_00103057;
      }
    }
    else if (opt == 2 && returnvalue == (void *)0x0) {
      __format = "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n";
      goto LAB_0010304d;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int check_retval(void* returnvalue, const char* funcname, int opt)
{
  int* retval;

  /* Check if SUNDIALS function returned NULL pointer - no memory allocated */
  if (opt == 0 && returnvalue == NULL)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return (1);
  }

  /* Check if retval < 0 */
  else if (opt == 1)
  {
    retval = (int*)returnvalue;
    if (*retval < 0)
    {
      fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
              funcname, *retval);
      return (1);
    }
  }

  /* Check if function returned NULL pointer - no memory allocated */
  else if (opt == 2 && returnvalue == NULL)
  {
    fprintf(stderr, "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return (1);
  }

  return (0);
}